

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

Value * duckdb::EnableProfilingSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  ClientConfig *pCVar1;
  InternalException *this;
  char *val;
  string local_58;
  LogicalType local_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  if (pCVar1->enable_profiler == false) {
    LogicalType::LogicalType(&local_38,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_38);
    LogicalType::~LogicalType(&local_38);
  }
  else {
    switch(pCVar1->profiler_print_format) {
    case QUERY_TREE:
      val = "query_tree";
      break;
    case JSON:
      val = "json";
      break;
    case QUERY_TREE_OPTIMIZER:
      val = "query_tree_optimizer";
      break;
    case NO_OUTPUT:
      val = "no_output";
      break;
    case HTML:
      val = "html";
      break;
    case GRAPHVIZ:
      val = "graphviz";
      break;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unsupported profiler print format","");
      InternalException::InternalException(this,&local_58);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::Value(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

Value EnableProfilingSetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	if (!config.enable_profiler) {
		return Value();
	}
	switch (config.profiler_print_format) {
	case ProfilerPrintFormat::JSON:
		return Value("json");
	case ProfilerPrintFormat::QUERY_TREE:
		return Value("query_tree");
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return Value("query_tree_optimizer");
	case ProfilerPrintFormat::NO_OUTPUT:
		return Value("no_output");
	case ProfilerPrintFormat::HTML:
		return Value("html");
	case ProfilerPrintFormat::GRAPHVIZ:
		return Value("graphviz");
	default:
		throw InternalException("Unsupported profiler print format");
	}
}